

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testcrypt.c
# Opt level: O0

void finaliser_return_opt_string_asciz_const(strbuf *out,void *ctx)

{
  char *s;
  char *val;
  char **valp;
  void *ctx_local;
  strbuf *out_local;
  
  s = *ctx;
  safefree(ctx);
  if (s == (char *)0x0) {
    BinarySink_put_fmt(out->binarysink_,"NULL\n");
  }
  else {
    return_val_string_asciz_const(out,s);
  }
  return;
}

Assistant:

static void finaliser_return_opt_string_asciz_const(strbuf *out, void *ctx)
{
    const char **valp = (const char **)ctx;
    const char *val = *valp;
    sfree(valp);
    if (!val)
        put_fmt(out, "NULL\n");
    else
        return_val_string_asciz_const(out, val);
}